

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

result_type __thiscall
Catch::uniform_integer_distribution<unsigned_long>::operator()
          (uniform_integer_distribution<unsigned_long> *this,SimplePcg32 *g)

{
  enable_if_t<sizeof(typename_SimplePcg32::result_type)_<_sizeof(unsigned_long),_unsigned_long>
  eVar1;
  long in_RDI;
  ExtendedMultResult<unsigned_long> emul;
  enable_if_t<sizeof(typename_SimplePcg32::result_type)_<_sizeof(unsigned_long),_unsigned_long>
  random_number;
  SimplePcg32 *in_stack_ffffffffffffffd0;
  ExtendedMultResult<unsigned_long> local_30;
  undefined8 uStack_28;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    std::enable_if<(sizeof(Catch::SimplePcg32::result_type))<(sizeof(unsigned_long)),unsigned_long>
    ::type_Catch::Detail::fillBitsFrom<unsigned_long,Catch::SimplePcg32>(in_stack_ffffffffffffffd0);
    local_8 = transposeBack(0x1d9110);
  }
  else {
    eVar1 = std::enable_if<(sizeof(Catch::SimplePcg32::
            result_type))<(sizeof(unsigned_long)),unsigned_long>::type_Catch::Detail::
            fillBitsFrom<unsigned_long,Catch::SimplePcg32>(in_stack_ffffffffffffffd0);
    local_30 = Detail::extendedMult(eVar1,*(uint64_t *)(in_RDI + 8));
    while (uStack_28 < *(ulong *)(in_RDI + 0x10)) {
      eVar1 = std::enable_if<(sizeof(Catch::SimplePcg32::
              result_type))<(sizeof(unsigned_long)),unsigned_long>::type_Catch::Detail::
              fillBitsFrom<unsigned_long,Catch::SimplePcg32>(in_stack_ffffffffffffffd0);
      local_30 = Detail::extendedMult(eVar1,*(uint64_t *)(in_RDI + 8));
    }
    local_8 = transposeBack(0x1d91ac);
  }
  return local_8;
}

Assistant:

result_type operator()( Generator& g ) {
        // All possible values of result_type are valid.
        if ( m_ab_distance == 0 ) {
            return transposeBack( Detail::fillBitsFrom<UnsignedIntegerType>( g ) );
        }

        auto random_number = Detail::fillBitsFrom<UnsignedIntegerType>( g );
        auto emul = Detail::extendedMult( random_number, m_ab_distance );
        // Unlike Lemire's algorithm we skip the ab_distance check, since
        // we precomputed the rejection threshold, which is always tighter.
        while (emul.lower < m_rejection_threshold) {
            random_number = Detail::fillBitsFrom<UnsignedIntegerType>( g );
            emul = Detail::extendedMult( random_number, m_ab_distance );
        }

        return transposeBack(m_a + emul.upper);
    }